

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmlookup.cpp
# Opt level: O1

void __thiscall
CVmObjWeakRefLookupTable::mark_undo_ref(CVmObjWeakRefLookupTable *this,CVmUndoRecord *undo_rec)

{
  uint uVar1;
  CVmObjPageEntry *pCVar2;
  ushort uVar3;
  uint uVar4;
  
  if (*(int *)((long)(undo_rec->id).ptrval + 8) == 5) {
    uVar1 = *(uint *)((long)(undo_rec->id).ptrval + 0x10);
    pCVar2 = G_obj_table_X.pages_[uVar1 >> 0xc];
    uVar4 = uVar1 & 0xfff;
    uVar3 = *(ushort *)&pCVar2[uVar4].field_0x14;
    if ((uVar3 & 0x20c) == 0x200) {
      pCVar2[uVar4].next_obj_ = G_obj_table_X.gc_queue_head_;
      uVar3 = *(ushort *)&pCVar2[uVar4].field_0x14;
      G_obj_table_X.gc_queue_head_ = uVar1;
    }
    else if ((uVar3 & 8) != 0) {
      return;
    }
    *(ushort *)&pCVar2[uVar4].field_0x14 = uVar3 & 0xfff3 | 8;
  }
  return;
}

Assistant:

void CVmObjWeakRefLookupTable::
   mark_undo_ref(VMG_ struct CVmUndoRecord *undo_rec)
{
    lookuptab_undo_rec *rec;

    /* get our private record from the standard undo record */
    rec = (lookuptab_undo_rec *)undo_rec->id.ptrval;

    /* if the key in the record is an object, mark it referenced */
    if (rec->key.typ == VM_OBJ)
        G_obj_table->mark_all_refs(rec->key.val.obj, VMOBJ_REACHABLE);
}